

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Celero.cpp
# Opt level: O1

shared_ptr<celero::Benchmark> __thiscall
celero::RegisterBaseline
          (celero *this,char *groupName,char *benchmarkName,uint64_t samples,uint64_t iterations,
          uint64_t threads,shared_ptr<celero::Factory> *experimentFactory)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  Benchmark *this_01;
  Experiment *this_02;
  _Alloc_hider _Var1;
  size_type sVar2;
  string *x;
  TestVector *this_03;
  size_t sVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  shared_ptr<celero::Benchmark> sVar4;
  shared_ptr<celero::Experiment> p;
  Experiment *local_a8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_a0;
  string local_98;
  celero *local_70;
  char *local_68;
  shared_ptr<celero::Experiment> local_60;
  shared_ptr<celero::Factory> local_50;
  shared_ptr<celero::Benchmark> local_40;
  
  if (benchmarkName == (char *)0x0 || groupName == (char *)0x0) {
    *(undefined8 *)this = 0;
    *(undefined8 *)(this + 8) = 0;
  }
  else {
    local_68 = groupName;
    x = (string *)TestVector::Instance();
    std::__cxx11::string::string((string *)&local_98,local_68,(allocator *)&local_a8);
    TestVector::operator[]((TestVector *)this,x);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    }
    local_70 = this;
    if (*(long *)this == 0) {
      local_98._M_dataplus._M_p = (pointer)0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<celero::Benchmark,std::allocator<celero::Benchmark>,char_const*&>
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_98._M_string_length,
                 (Benchmark **)&local_98,(allocator<celero::Benchmark> *)&local_a8,&local_68);
      sVar2 = local_98._M_string_length;
      _Var1._M_p = local_98._M_dataplus._M_p;
      local_98._M_dataplus._M_p = (pointer)0x0;
      local_98._M_string_length = 0;
      this_00 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(this + 8);
      *(pointer *)this = _Var1._M_p;
      *(size_type *)(this + 8) = sVar2;
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98._M_string_length !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98._M_string_length);
      }
      this_03 = TestVector::Instance();
      local_40.super___shared_ptr<celero::Benchmark,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           *(element_type **)this;
      local_40.super___shared_ptr<celero::Benchmark,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(this + 8);
      if (local_40.super___shared_ptr<celero::Benchmark,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_40.super___shared_ptr<celero::Benchmark,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi)->_M_use_count =
               (local_40.super___shared_ptr<celero::Benchmark,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_40.super___shared_ptr<celero::Benchmark,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi)->_M_use_count =
               (local_40.super___shared_ptr<celero::Benchmark,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
        }
      }
      TestVector::push_back(this_03,&local_40);
      if (local_40.super___shared_ptr<celero::Benchmark,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_40.super___shared_ptr<celero::Benchmark,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
    }
    local_a8 = (Experiment *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<celero::Experiment,std::allocator<celero::Experiment>,std::shared_ptr<celero::Benchmark>&>
              (&local_a0,&local_a8,(allocator<celero::Experiment> *)&local_98,
               (shared_ptr<celero::Benchmark> *)this);
    Experiment::setIsBaselineCase(local_a8,true);
    this_02 = local_a8;
    local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
    sVar3 = strlen(benchmarkName);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_98,benchmarkName,benchmarkName + sVar3);
    Experiment::setName(this_02,&local_98);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    }
    Experiment::setSamples(local_a8,samples);
    Experiment::setIterations(local_a8,iterations);
    Experiment::setThreads(local_a8,threads);
    local_50.super___shared_ptr<celero::Factory,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (experimentFactory->super___shared_ptr<celero::Factory,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
    ;
    local_50.super___shared_ptr<celero::Factory,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (experimentFactory->super___shared_ptr<celero::Factory,_(__gnu_cxx::_Lock_policy)2>).
         _M_refcount._M_pi;
    if (local_50.super___shared_ptr<celero::Factory,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_50.super___shared_ptr<celero::Factory,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
        ->_M_use_count =
             (local_50.super___shared_ptr<celero::Factory,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_50.super___shared_ptr<celero::Factory,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
        ->_M_use_count =
             (local_50.super___shared_ptr<celero::Factory,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi)->_M_use_count + 1;
      }
    }
    Experiment::setFactory(local_a8,&local_50);
    if (local_50.super___shared_ptr<celero::Factory,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_50.super___shared_ptr<celero::Factory,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    Experiment::setBaselineTarget(local_a8,1.0);
    this = local_70;
    this_01 = *(Benchmark **)local_70;
    local_60.super___shared_ptr<celero::Experiment,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_a8;
    local_60.super___shared_ptr<celero::Experiment,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         local_a0._M_pi;
    if (local_a0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_a0._M_pi)->_M_use_count = (local_a0._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_a0._M_pi)->_M_use_count = (local_a0._M_pi)->_M_use_count + 1;
      }
    }
    Benchmark::setBaseline(this_01,&local_60);
    benchmarkName = (char *)extraout_RDX;
    if (local_60.super___shared_ptr<celero::Experiment,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_60.super___shared_ptr<celero::Experiment,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
      benchmarkName = (char *)extraout_RDX_00;
    }
    if (local_a0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_a0._M_pi);
      benchmarkName = (char *)extraout_RDX_01;
    }
  }
  sVar4.super___shared_ptr<celero::Benchmark,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)benchmarkName;
  sVar4.super___shared_ptr<celero::Benchmark,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<celero::Benchmark>)
         sVar4.super___shared_ptr<celero::Benchmark,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<celero::Benchmark> celero::RegisterBaseline(const char* groupName, const char* benchmarkName, const uint64_t samples,
															const uint64_t iterations, const uint64_t threads,
															std::shared_ptr<celero::Factory> experimentFactory)
{
	if(groupName != nullptr && benchmarkName != nullptr)
	{
		auto bm = celero::TestVector::Instance()[groupName];

		if(bm == nullptr)
		{
			bm = std::make_shared<Benchmark>(groupName);
			celero::TestVector::Instance().push_back(bm);
		}

		auto p = std::make_shared<Experiment>(bm);
		p->setIsBaselineCase(true);
		p->setName(benchmarkName);
		p->setSamples(samples);
		p->setIterations(iterations);
		p->setThreads(threads);
		p->setFactory(experimentFactory);
		p->setBaselineTarget(1.0);

		bm->setBaseline(p);

		return bm;
	}

	return nullptr;
}